

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O2

addr_type __thiscall
LdConfigDirWrapper::containsAddrType(LdConfigDirWrapper *this,size_t fieldId,size_t subField)

{
  addr_type aVar1;
  
  aVar1 = NOT_ADDR;
  if (fieldId - 9 < 0x25) {
    aVar1 = *(addr_type *)("18LdConfigDirWrapper" + fieldId * 4 + 8);
  }
  return aVar1;
}

Assistant:

Executable::addr_type LdConfigDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case LOCK_PREFIX :
        case EDIT_LIST :
        case SEC_COOKIE :
        case SEH_TABLE :
        case GUARD_CHECK :
        case GUARD_DISPATCH :
        case GUARD_TABLE :
        case GUARD_ADDR_IAT_ENTRY_TABLE:
        case GUARD_LONG_JUMP_TABLE:
        case DYNAMIC_VAL_RELOC:
        case GUARD_FAILURE_ROUTINE:
        case GUARD_FAILURE_ROUTINE_FUNC_PTR:
        case GUARD_VERIFY_STACK_PTR:
        case ENCLAVE_CONFIG_PTR:
        case VOLATILE_METADATA_PTR:
        case GUARD_EH_CONT_TABLE:
            return Executable::VA;
    }
    return Executable::NOT_ADDR;
}